

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O2

Reals __thiscall Omega_h::measure_edges_metric(Omega_h *this,Mesh *mesh,Reals *metrics)

{
  LO size_in;
  void *extraout_RDX;
  Reals RVar1;
  allocator local_69;
  Write<double> local_68;
  Write<int> local_58;
  string local_48;
  
  size_in = Mesh::nedges(mesh);
  std::__cxx11::string::string((string *)&local_48,"",&local_69);
  Read<int>::Read((Read<int> *)&local_58,size_in,0,1,&local_48);
  Write<double>::Write(&local_68,&metrics->write_);
  measure_edges_metric(this,mesh,(LOs *)&local_58,(Reals *)&local_68);
  Write<double>::~Write(&local_68);
  Write<int>::~Write(&local_58);
  std::__cxx11::string::~string((string *)&local_48);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals measure_edges_metric(Mesh* mesh, Reals metrics) {
  return measure_edges_metric(mesh, LOs(mesh->nedges(), 0, 1), metrics);
}